

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

string * __thiscall
LinkedObjectFile::print_disassembly_abi_cxx11_
          (string *__return_storage_ptr__,LinkedObjectFile *this)

{
  vector<Label,_std::allocator<Label>_> *this_00;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Config *pCVar7;
  reference pvVar8;
  reference pvVar9;
  reference this_01;
  reference word;
  reference pvVar10;
  reference pvVar11;
  ulong __n;
  pointer pFVar12;
  size_type __n_00;
  LinkedWord *word_00;
  uint seg;
  ulong local_d8;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  *local_68;
  pointer local_60;
  vector<Instruction,_std::allocator<Instruction>_> *local_58;
  string local_50;
  
  pCVar7 = get_config();
  bVar1 = pCVar7->write_hex_near_instructions;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  seg = this->segments;
  if (3 < (int)seg) {
    __assert_fail("segments <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x1fe,"std::string LinkedObjectFile::print_disassembly()");
  }
  local_68 = &this->functions_by_seg;
  this_00 = &this->labels;
  local_78 = &this->words_by_seg;
  local_70 = &this->offset_of_data_zone_by_seg;
  do {
    if ((int)seg < 1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    seg = seg - 1;
    __n = (ulong)seg;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pvVar8 = std::
             vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ::at(local_68,__n);
    local_60 = (pvVar8->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    for (pFVar12 = (pvVar8->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                   super__Vector_impl_data._M_start; pFVar12 != local_60; pFVar12 = pFVar12 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_98,"; .function ",&pFVar12->guessed_name);
      std::operator+(&line,&local_98,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Function::Prologue::to_string_abi_cxx11_(&local_98,&pFVar12->prologue,2);
      std::operator+(&line,&local_98,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&local_98);
      local_58 = &pFVar12->instructions;
      bVar2 = 0;
      iVar6 = 1;
      for (__n_00 = 1; (long)__n_00 < (long)pFVar12->end_word - (long)pFVar12->start_word;
          __n_00 = __n_00 + 1) {
        iVar4 = get_label_at(this,seg,(pFVar12->start_word + (int)__n_00) * 4);
        if (iVar4 != -1) {
          pvVar9 = std::vector<Label,_std::allocator<Label>_>::at(this_00,(long)iVar4);
          std::operator+(&line,&pvVar9->name,":\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&line);
        }
        iVar4 = 1;
        while( true ) {
          if (iVar4 == 4) break;
          iVar5 = get_label_at(this,seg,iVar4 + (pFVar12->start_word + iVar6) * 4);
          if (iVar5 != -1) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            iVar6 = get_label_at(this,seg,iVar4 + (iVar6 + pFVar12->start_word) * 4);
            pvVar9 = std::vector<Label,_std::allocator<Label>_>::at(this_00,(long)iVar6);
            std::operator+(&line,&pvVar9->name,"\n");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&line);
            std::__cxx11::string::~string((string *)&line);
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                          ,0x21a,"std::string LinkedObjectFile::print_disassembly()");
          }
          iVar4 = iVar4 + 1;
        }
        this_01 = std::vector<Instruction,_std::allocator<Instruction>_>::at(local_58,__n_00);
        Instruction::to_string_abi_cxx11_(&local_98,this_01,this);
        std::operator+(&line,"    ",&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        if (bVar1 == false) {
          std::operator+(&local_98,&line,"\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_98);
        }
        else {
          if (line._M_string_length < 0x3c) {
            std::__cxx11::string::append((ulong)&line,'<' - (char)line._M_string_length);
          }
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          word = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                           ((local_78->
                            super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + __n,
                            (long)(int)__n_00 + (long)pFVar12->start_word);
          append_word_to_string(this,__return_storage_ptr__,word);
        }
        if ((bVar2 & 1) != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        bVar2 = gOpcodeInfo[(int)this_01->kind].has_delay_slot;
        std::__cxx11::string::~string((string *)&line);
        iVar6 = iVar6 + 1;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_70,__n);
    local_d8 = (ulong)*pvVar10;
    iVar6 = *pvVar10 * 4;
    while( true ) {
      pvVar11 = std::
                vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                ::at(local_78,__n);
      if ((ulong)(((long)(pvVar11->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar11->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x30) <= local_d8) break;
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        iVar5 = get_label_at(this,seg,iVar6 + iVar4);
        if (iVar5 != -1) {
          pvVar9 = std::vector<Label,_std::allocator<Label>_>::at(this_00,(long)iVar5);
          std::operator+(&line,&pvVar9->name,":");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&line);
          if (iVar4 != 0) {
            std::__cxx11::to_string(&local_50,iVar4);
            std::operator+(&local_98," (offset ",&local_50);
            std::operator+(&line,&local_98,")");
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&line);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      word_00 = (LinkedWord *)
                (local_d8 * 0x30 +
                *(long *)&(this->words_by_seg).
                          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[__n].
                          super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                          super__Vector_impl_data);
      append_word_to_string(this,__return_storage_ptr__,word_00);
      if (word_00->kind == TYPE_PTR) {
        bVar3 = std::operator==(&word_00->symbol_name,"string");
        if (bVar3) {
          get_goal_string_abi_cxx11_(&local_50,this,seg,(int)local_d8);
          std::operator+(&local_98,"; ",&local_50);
          std::operator+(&line,&local_98,"\n");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&line);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      local_d8 = local_d8 + 1;
      iVar6 = iVar6 + 4;
    }
  } while( true );
}

Assistant:

std::string LinkedObjectFile::print_disassembly() {
  bool write_hex = get_config().write_hex_near_instructions;
  std::string result;

  assert(segments <= 3);
  for (int seg = segments; seg-- > 0;) {
    // segment header
    result += ";------------------------------------------\n;  ";
    result += segment_names[seg];
    result += "\n;------------------------------------------\n\n";

    // functions
    for (auto& func : functions_by_seg.at(seg)) {
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += "; .function " + func.guessed_name + "\n";
      result += ";;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;;\n";
      result += func.prologue.to_string(2) + "\n";

      // print each instruction in the function.
      bool in_delay_slot = false;

      for (int i = 1; i < func.end_word - func.start_word; i++) {
        auto label_id = get_label_at(seg, (func.start_word + i) * 4);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":\n";
        }

        for (int j = 1; j < 4; j++) {
          //          assert(get_label_at(seg, (func.start_word + i)*4 + j) == -1);
          if (get_label_at(seg, (func.start_word + i) * 4 + j) != -1) {
            result += "BAD OFFSET LABEL: ";
            result += labels.at(get_label_at(seg, (func.start_word + i) * 4 + j)).name + "\n";
            assert(false);
          }
        }

        auto& instr = func.instructions.at(i);
        std::string line = "    " + instr.to_string(*this);

        if (write_hex) {
          if (line.length() < 60) {
            line.append(60 - line.length(), ' ');
          }
          result += line;
          result += " ;;";
          auto& word = words_by_seg[seg].at(func.start_word + i);
          append_word_to_string(result, word);
        } else {
          result += line + "\n";
        }

        if (in_delay_slot) {
          result += "\n";
          in_delay_slot = false;
        }

        if (gOpcodeInfo[(int)instr.kind].has_delay_slot) {
          in_delay_slot = true;
        }
      }
      result += "\n";
      //
      //      int bid = 0;
      //      for(auto& bblock : func.basic_blocks) {
      //        result += "BLOCK " + std::to_string(bid++)+ "\n";
      //        for(int i = bblock.start_word; i < bblock.end_word; i++) {
      //          if(i >= 0 && i < func.instructions.size()) {
      //            result += func.instructions.at(i).to_string(*this) + "\n";
      //          } else {
      //            result += "BAD BBLOCK INSTR ID " + std::to_string(i);
      //          }
      //        }
      //      }
    }

    // print data
    for (size_t i = offset_of_data_zone_by_seg.at(seg); i < words_by_seg.at(seg).size(); i++) {
      for (int j = 0; j < 4; j++) {
        auto label_id = get_label_at(seg, i * 4 + j);
        if (label_id != -1) {
          result += labels.at(label_id).name + ":";
          if (j != 0) {
            result += " (offset " + std::to_string(j) + ")";
          }
          result += "\n";
        }
      }

      auto& word = words_by_seg[seg][i];
      append_word_to_string(result, word);

      if (word.kind == LinkedWord::TYPE_PTR && word.symbol_name == "string") {
        result += "; " + get_goal_string(seg, i) + "\n";
      }
    }
  }

  return result;
}